

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscPStackEntry.cpp
# Opt level: O2

void __thiscall CNscPStackEntry::~CNscPStackEntry(CNscPStackEntry *this)

{
  anon_union_8_2_ecfd7102_for_NscSymbolFence_9 this_00;
  uchar *puVar1;
  char *pcVar2;
  NscSymbolFence *pNVar3;
  
  pNVar3 = this->m_pFence;
  if (pNVar3 != (NscSymbolFence *)0x0) {
    if (pNVar3->nFenceType == NscFenceType_Switch) {
      this_00 = pNVar3->field_9;
      if (this_00 != (anon_union_8_2_ecfd7102_for_NscSymbolFence_9)0x0) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)this_00);
      }
      operator_delete((void *)this_00);
      pNVar3 = this->m_pFence;
    }
    operator_delete(pNVar3);
  }
  puVar1 = this->m_pauchData;
  if (puVar1 != (uchar *)0x0 && puVar1 != this->m_auchDataFast) {
    operator_delete__(puVar1);
  }
  pcVar2 = this->m_pszId;
  if (pcVar2 != (char *)0x0 && pcVar2 != this->m_achIdFast) {
    operator_delete__(pcVar2);
  }
  CNwnDoubleLinkList::Remove(&this->m_link);
  return;
}

Assistant:

CNscPStackEntry::~CNscPStackEntry ()
{

	//
	// Delete any of our allocated variables
	//

	if (m_pFence)
	{
		if (m_pFence ->nFenceType == NscFenceType_Switch)
			delete m_pFence ->pSwitchCasesUsed;
		delete m_pFence;
	}
	if (m_pauchData != m_auchDataFast)
		delete [] m_pauchData;
	if (m_pszId != m_achIdFast)
		delete [] m_pszId;
}